

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O2

void __thiscall
Selector::addListener
          (Selector *this,int fd,short events,SelectorListener *listener,jh_ptr_int_t private_data)

{
  AutoLock l;
  ListenerNode *node;
  
  node = (ListenerNode *)
         operator_new(0x18,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                      ,0x68);
  node->mFd = fd;
  node->mEvents = events;
  node->mListener = listener;
  node->mPrivateData = private_data;
  AutoLock::AutoLock(&l,&this->mLock);
  JetHead::list<Selector::ListenerNode_*>::push_back(&this->mList,&node);
  updateListeners(this);
  AutoLock::~AutoLock(&l);
  return;
}

Assistant:

void Selector::addListener( int fd, short events, SelectorListener *listener, jh_ptr_int_t private_data )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	ListenerNode *node = jh_new ListenerNode();
	
	node->mFd = fd;
	node->mEvents = events;
	node->mListener = listener;
	node->mPrivateData = private_data;
	
	AutoLock l( mLock );
	
	mList.push_back( node );	
	updateListeners();	
	
	LOG( "added fd %d events %x, list size %d", fd, events, mList.size() );
}